

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::PackUnorm2x16Case::iterate(PackUnorm2x16Case *this)

{
  ulong uVar1;
  Precision PVar2;
  uint uVar3;
  ShaderExecutor *pSVar4;
  uint uVar5;
  PackUnorm2x16Case *pPVar6;
  deUint32 dVar7;
  float afVar8 [2];
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *description;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ostringstream *poVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  float fVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  float local_228 [2];
  long lStack_220;
  long local_218;
  Hex<8UL> local_210;
  PackUnorm2x16Case *local_208;
  int local_1fc;
  undefined8 local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  ulong local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  undefined1 auVar24 [16];
  
  dVar7 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar7 ^ 0x776002);
  local_218 = 0;
  local_228[0] = 0.0;
  local_228[1] = 0.0;
  lStack_220 = 0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PVar2 = this->m_precision;
  if (PVar2 == PRECISION_MEDIUMP) {
    uVar10 = 0x41;
  }
  else {
    uVar10 = 1;
    if ((PVar2 != PRECISION_HIGHP) && (uVar10 = 0x101, PVar2 != PRECISION_LOWP)) {
      uVar10 = 0;
    }
  }
  local_1b0._0_4_ = 0.0;
  local_1b0._4_4_ = 0.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.5;
  local_1b0._4_4_ = 1.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 1.0;
  local_1b0._4_4_ = 0.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = -0.5;
  local_1b0._4_4_ = 1.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.25;
  local_1b0._4_4_ = 0.75;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  iVar13 = 0xf;
  do {
    fVar20 = deRandom_getFloat(&local_1c0);
    local_1f8 = (pointer)CONCAT44(extraout_XMM0_Db,fVar20);
    fVar20 = deRandom_getFloat(&local_1c0);
    local_1b0._0_4_ = (float)local_1f8 * 1.25;
    local_1b0._4_4_ = fVar20 * 1.25;
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
               (Vector<float,_2> *)local_1b0);
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  iVar13 = 0x50;
  do {
    fVar20 = deRandom_getFloat(&local_1c0);
    local_1f8 = (pointer)CONCAT44(extraout_XMM0_Db_00,fVar20);
    fVar20 = deRandom_getFloat(&local_1c0);
    local_1b0._0_4_ = (float)local_1f8 * 1e+06 + -100000.0;
    local_1b0._4_4_ = fVar20 * 1e+06 + -100000.0;
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
               (Vector<float,_2> *)local_1b0);
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1e8,lStack_220 - (long)local_228 >> 3);
  local_1b0._0_8_ =
       ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar16 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar16,"Executing shader for ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar16);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_4_ = local_228[0];
  local_1b0._4_4_ = local_228[1];
  local_210.value =
       (deUint64)
       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar4 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar4->_vptr_ShaderExecutor[6])
            (pSVar4,(ulong)(lStack_220 - (long)local_228) >> 3,local_1b0,&local_210);
  uVar12 = (ulong)(lStack_220 - (long)local_228) >> 3;
  local_208 = this;
  local_1c8 = uVar12;
  if ((int)uVar12 < 1) {
    iVar13 = 0;
  }
  else {
    lVar17 = 0;
    iVar13 = 0;
    afVar8 = local_228;
    lVar9 = lStack_220;
    do {
      poVar16 = (ostringstream *)(local_1b0 + 8);
      uVar1 = *(ulong *)((long)afVar8 + lVar17 * 8);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar1;
      auVar23 = minps(ZEXT816(0x3f8000003f800000),auVar23);
      fVar20 = (float)(-(uint)(0.0 <= (float)uVar1) & (uint)(auVar23._0_4_ * 65535.0));
      fVar21 = (float)(-(uint)(0.0 <= (float)(uVar1 >> 0x20)) & (uint)(auVar23._4_4_ * 65535.0));
      iVar18 = -(uint)(fVar20 < 0.0);
      iVar19 = -(uint)(fVar21 < 0.0);
      auVar25._4_4_ = iVar19;
      auVar25._0_4_ = iVar18;
      auVar25._8_4_ = iVar19;
      auVar25._12_4_ = iVar19;
      auVar24._8_8_ = auVar25._8_8_;
      auVar24._4_4_ = iVar18;
      auVar24._0_4_ = iVar18;
      uVar11 = movmskpd((int)uVar12,auVar24);
      fVar22 = -0.5;
      if ((uVar11 & 1) == 0) {
        fVar22 = 0.5;
      }
      uVar14 = (uint)(fVar22 + fVar20);
      if (0xfffe < (int)uVar14) {
        uVar14 = 0xffff;
      }
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      fVar20 = -0.5;
      if ((uVar11 & 2) == 0) {
        fVar20 = 0.5;
      }
      uVar11 = (uint)(fVar21 + fVar20);
      if (0xfffe < (int)uVar11) {
        uVar11 = 0xffff;
      }
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      uVar3 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar17];
      local_1f8 = (pointer)(ulong)uVar3;
      uVar15 = uVar14 - (uVar3 & 0xffff);
      uVar5 = -uVar15;
      if (0 < (int)uVar15) {
        uVar5 = uVar15;
      }
      uVar15 = uVar11 - (uVar3 >> 0x10);
      uVar3 = -uVar15;
      if (0 < (int)uVar15) {
        uVar3 = uVar15;
      }
      if ((uVar10 < uVar5) || (uVar10 < uVar3)) {
        if (iVar13 < 10) {
          local_1b0._0_8_ =
               ((local_208->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          poVar16 = (ostringstream *)(local_1b0 + 8);
          local_1fc = iVar13;
          std::__cxx11::ostringstream::ostringstream(poVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar16,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar16,(int)lVar17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar16,", expected packUnorm2x16(",0x19);
          tcu::operator<<((ostream *)poVar16,(Vector<float,_2> *)(lVar17 * 8 + (long)local_228));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,") = ",4);
          local_210.value = (deUint64)(uVar11 << 0x10 | uVar14);
          tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)poVar16);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,", got ",6);
          local_210.value = (deUint64)local_1f8;
          tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)poVar16);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,"\n  diffs = (",0xc)
          ;
          std::ostream::operator<<(poVar16,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,", ",2);
          std::ostream::operator<<(poVar16,uVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar16,"), max diff = ",0xe);
          std::ostream::operator<<(poVar16,uVar10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar16);
          std::ios_base::~ios_base(local_138);
          iVar13 = local_1fc;
        }
        else if (iVar13 == 10) {
          local_1b0._0_8_ =
               ((local_208->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar16);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar16);
          std::ios_base::~ios_base(local_138);
        }
        iVar13 = iVar13 + 1;
        afVar8 = local_228;
        lVar9 = lStack_220;
      }
      lVar17 = lVar17 + 1;
      uVar12 = (ulong)(int)((ulong)(lVar9 - (long)afVar8) >> 3);
    } while (lVar17 < (long)uVar12);
  }
  pPVar6 = local_208;
  local_1b0._0_8_ =
       ((local_208->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar16 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar16);
  iVar18 = (int)local_1c8;
  std::ostream::operator<<(poVar16,iVar18 - iVar13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16," / ",3);
  std::ostream::operator<<(poVar16,iVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar16);
  std::ios_base::~ios_base(local_138);
  description = "Pass";
  if (iVar13 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((pPVar6->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar13 != 0),description);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228 != (float  [2])0x0) {
    operator_delete((void *)local_228,local_218 - (long)local_228);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1		:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 65	:		// (2^-10) * (2^16) + 1
												  m_precision == glu::PRECISION_LOWP	? 257	: 0;	// (2^-8) * (2^16) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(0.5f, 1.0f));
		inputs.push_back(tcu::Vec2(1.0f, 0.5f));
		inputs.push_back(tcu::Vec2(-0.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*1.25f;
			const float y = rnd.getFloat()*1.25f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 1e5f;
			const float y = rnd.getFloat()*1e6f - 1e5f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), 0.0f, 1.0f) * 65535.0f), 0, (1<<16)-1);
				const deUint16	ref1	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), 0.0f, 1.0f) * 65535.0f), 0, (1<<16)-1);
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packUnorm2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}